

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O0

void __thiscall DBot::Set_enemy(DBot *this)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AActor *pAVar5;
  bool local_32;
  bool local_31;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *oldenemy;
  DBot *this_local;
  
  oldenemy = (AActor *)this;
  pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  if ((pAVar5 != (AActor *)0x0) &&
     (pAVar5 = TObjPtr<AActor>::operator->(&this->enemy), 0 < pAVar5->health)) {
    pAVar1 = this->player->mo;
    pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    bVar2 = P_CheckSight(&pAVar1->super_AActor,pAVar5,0);
    if (bVar2) {
      local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
      goto LAB_00564410;
    }
  }
  local_18 = (AActor *)0x0;
LAB_00564410:
  iVar3 = FIntCVar::operator_cast_to_int(&deathmatch);
  if ((iVar3 != 0) ||
     (pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy), pAVar5 == (AActor *)0x0
     )) {
    pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    this->allround = pAVar5 != (AActor *)0x0;
    pAVar5 = Find_enemy(this);
    TObjPtr<AActor>::operator=(&this->enemy,pAVar5);
    pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
    if (pAVar5 == (AActor *)0x0) {
      TObjPtr<AActor>::operator=(&this->enemy,local_18);
    }
  }
  pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
  local_31 = false;
  if (pAVar5 != (AActor *)0x0) {
    pAVar5 = TObjPtr<AActor>::operator->(&this->enemy);
    local_32 = true;
    if (-1 < pAVar5->health) {
      pAVar5 = TObjPtr<AActor>::operator->(&this->enemy);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_1c,(int)pAVar5 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar4 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
      local_32 = true;
      if (uVar4 != 0) {
        pAVar1 = this->player->mo;
        pAVar5 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->enemy);
        local_32 = AActor::IsFriend(&pAVar1->super_AActor,pAVar5);
      }
    }
    local_31 = local_32;
  }
  if (local_31 != false) {
    TObjPtr<AActor>::operator=(&this->enemy,(AActor *)0x0);
  }
  return;
}

Assistant:

void DBot::Set_enemy ()
{
	AActor *oldenemy;

	if (enemy
		&& enemy->health > 0
		&& P_CheckSight (player->mo, enemy))
	{
		oldenemy = enemy;
	}
	else
	{
		oldenemy = NULL;
	}

	// [RH] Don't even bother looking for a different enemy if this is not deathmatch
	// and we already have an existing enemy.
	if (deathmatch || !enemy)
	{
		allround = !!enemy;
		enemy = Find_enemy();
		if (!enemy)
			enemy = oldenemy; //Try go for last (it will be NULL if there wasn't anyone)
	}
	//Verify that that enemy is really something alive that bot can kill.
	if (enemy && ((enemy->health < 0 || !(enemy->flags&MF_SHOOTABLE)) || player->mo->IsFriend(enemy)))
		enemy = NULL;
}